

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Graph<Node> * __thiscall
Graph<Node>::minSpanningTree(Graph<Node> *__return_storage_ptr__,Graph<Node> *this,int node)

{
  Edge *pEVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int dest;
  int source;
  Graph<Node> *local_78;
  Edge local_70;
  vector<Edge> ccEdges;
  vector<int> depth;
  vector<int> father;
  
  local_78 = __return_storage_ptr__;
  vector<int>::vector(&father,this->_nodeCnt);
  vector<int>::vector(&depth,this->_nodeCnt);
  for (lVar5 = 0; lVar5 < this->_nodeCnt; lVar5 = lVar5 + 1) {
    father.vect[lVar5] = (int)lVar5;
    depth.vect[lVar5] = 1;
  }
  iVar3 = (this->inCC).vect[node];
  vector<Edge>::vector(&ccEdges);
  lVar5 = 8;
  for (lVar6 = 0; lVar6 < (this->edges)._size; lVar6 = lVar6 + 1) {
    pEVar1 = (this->edges).vect;
    uVar2 = *(undefined8 *)((long)pEVar1 + lVar5 + -8);
    local_70._nodeS = (int)uVar2;
    local_70._nodeD = (int)((ulong)uVar2 >> 0x20);
    local_70._cost = *(int *)((long)&pEVar1->_nodeS + lVar5);
    if ((this->inCC).vect[local_70._nodeS] == iVar3) {
      vector<Edge>::push_back(&ccEdges,&local_70);
    }
    lVar5 = lVar5 + 0xc;
  }
  std::__sort<Edge*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const&,Edge_const&)>>
            (ccEdges.vect,ccEdges.vect + ccEdges._size,
             (_Iter_comp_iter<bool_(*)(const_Edge_&,_const_Edge_&)>)0x103790);
  Graph(local_78,this->_nodeCnt);
  lVar5 = 4;
  for (lVar6 = 0; lVar6 < ccEdges._size; lVar6 = lVar6 + 1) {
    source = *(int *)((long)ccEdges.vect + lVar5 + -4);
    uVar2 = *(undefined8 *)((long)&(ccEdges.vect)->_nodeS + lVar5);
    local_70._nodeD = (int)uVar2;
    local_70._cost = (int)((ulong)uVar2 >> 0x20);
    dest = local_70._nodeD;
    local_70._nodeS = source;
    iVar3 = findRt(this,&father,&source);
    iVar4 = findRt(this,&father,&dest);
    if (iVar3 != iVar4) {
      mergeDSU(this,&father,&depth,source,dest);
      addEdge(local_78,&local_70);
    }
    lVar5 = lVar5 + 0xc;
  }
  vector<Edge>::~vector(&ccEdges);
  vector<int>::~vector(&depth);
  vector<int>::~vector(&father);
  return local_78;
}

Assistant:

Graph minSpanningTree(int node) {
        vector <int> father(_nodeCnt);
        vector <int> depth(_nodeCnt);

        for (int i = 0; i < _nodeCnt; ++i) {
            father[i] = i;
            depth[i] = 1;
        }

        int currCC = inCC[node];

        vector <Edge> ccEdges;
        for (int i = 0; i < edges.size(); ++i) {
            Edge currEdge = getEdge(i);
            int source = currEdge.getSource();
            int dest = currEdge.getDest();

            if (inCC[source] == currCC) { //destination cannot be outside CC (the two nodes are connected)
                ccEdges.push_back(currEdge);
            }
        }

        std::sort(ccEdges.begin(), ccEdges.end(), byCostCmp);

//        ccEdges.mergeSort(0, ccEdges.size() - 1, [](Edge a, Edge b) {
//            return a.getCost() < b.getCost();
//        });

        Graph MST(_nodeCnt);

        for (int i = 0; i < ccEdges.size(); ++i) {
            Edge currEdge = ccEdges[i];
            int source = currEdge.getSource();
            int dest = currEdge.getDest();

            if (findRt(father, source) != findRt(father, dest)) {
                mergeDSU(father, depth, source, dest);
                MST.addEdge(currEdge);
            }
        }

        return MST;
    }